

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadratic_roundtrip_test.cxx
# Opt level: O2

void quadratic_roundtrip_endec_test<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>>(size_t rounds)

{
  size_t size;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>_> endec;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>_> local_a8;
  
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>_>::
  endec_pair_tester(&local_a8);
  for (size = 0; size <= rounds; size = size + 1) {
    cryptox::detail::make_random_vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,size);
    cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>>::
    check_roundtrip<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>> *)&local_a8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  }
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>_>::
  ~endec_pair_tester(&local_a8);
  return;
}

Assistant:

void quadratic_roundtrip_endec_test(const size_t rounds = 4096) {
	cryptox::tests::endec_pair_tester<Algorithm> endec;

	for (int i=0; i<=rounds; ++i) {
		using cryptox::detail::make_random_vector;
		endec.check_roundtrip(make_random_vector(i));
	}
}